

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O1

void __thiscall Sparse_matrix_Append_element(void *this,uint row,uint col,double value)

{
  long lVar1;
  uint uVar2;
  
  if (row != col) {
    *(int *)((long)this + 0x1c) = *(int *)((long)this + 0x1c) + 1;
    uVar2 = *(uint *)((long)this + 0x18);
    if (uVar2 < row) {
      lVar1 = *(long *)((long)this + 8);
      do {
        *(uint *)((long)this + 0x18) = uVar2 + 1;
        *(undefined4 *)(lVar1 + (ulong)(uVar2 + 1) * 4) = *(undefined4 *)((long)this + 0x1c);
        uVar2 = *(uint *)((long)this + 0x18);
      } while (uVar2 < row);
    }
    *(uint *)(*(long *)((long)this + 8) + (ulong)*(uint *)((long)this + 0x1c) * 4) = col;
    row = *(uint *)((long)this + 0x1c);
  }
  *(double *)(*(long *)((long)this + 0x10) + (ulong)row * 8) = value;
  return;
}

Assistant:

void Sparse_matrix_Append_element (
    Sparse_matrix * this,
    unsigned row,
    unsigned col,
    double value) {

  if (row == col) {
    this->elements[row] = value;
    return;
  }

  ++(this->filled_element);
  while (this->current_row < row) {
    ++(this->current_row);
    this->indices[this->current_row] = this->filled_element;
  }
  this->indices[this->filled_element] = col;
  this->elements[this->filled_element] = value;
}